

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::InvalidateDefaultFramebufferBindCase::render
          (InvalidateDefaultFramebufferBindCase *this,Surface *dst)

{
  deUint32 dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  DataTypes *samplerTypes;
  Context *pCVar5;
  size_type sVar6;
  ContextWrapper *this_00;
  deUint32 *local_600;
  Vector<float,_3> local_574;
  Vector<float,_3> local_568;
  Vector<float,_3> local_55c;
  Vector<float,_3> local_550;
  Vector<float,_4> local_544;
  Vector<float,_3> local_534;
  Vector<float,_3> local_528;
  Vector<float,_4> local_51c;
  Vector<float,_4> local_50c;
  Vector<float,_3> local_4fc;
  Vector<float,_3> local_4f0;
  Vector<float,_4> local_4e4;
  deUint32 local_4d4;
  deUint32 local_4d0;
  deUint32 gradShaderID;
  deUint32 texShaderID;
  deUint32 flatShaderID;
  vector<unsigned_int,_std::allocator<unsigned_int>_> attachments;
  GradientShader gradShader;
  Vector<float,_4> local_344;
  DataTypes local_328;
  undefined1 local_310 [8];
  Texture2DShader texShader;
  FlatColorShader flatShader;
  deUint32 tex;
  deUint32 fbo;
  Surface *dst_local;
  InvalidateDefaultFramebufferBindCase *this_local;
  
  flatShader.super_ShaderProgram._340_4_ = 0;
  flatShader.super_ShaderProgram.m_hasGeometryShader = false;
  flatShader.super_ShaderProgram._337_3_ = 0;
  FboTestUtil::FlatColorShader::FlatColorShader
            ((FlatColorShader *)&texShader.m_outputType,TYPE_FLOAT_VEC4);
  local_328.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FboTestUtil::DataTypes::DataTypes(&local_328);
  samplerTypes = FboTestUtil::DataTypes::operator<<(&local_328,TYPE_SAMPLER_2D);
  tcu::Vector<float,_4>::Vector(&local_344,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&gradShader.super_ShaderProgram.field_0x154,0.0)
  ;
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_310,samplerTypes,TYPE_FLOAT_VEC4,&local_344,
             (Vec4 *)&gradShader.super_ShaderProgram.field_0x154);
  FboTestUtil::DataTypes::~DataTypes(&local_328);
  FboTestUtil::GradientShader::GradientShader
            ((GradientShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,TYPE_FLOAT_VEC4);
  getDefaultFBDiscardAttachments
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texShaderID,this->m_buffers);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  gradShaderID = (*pCVar5->_vptr_Context[0x75])(pCVar5,&texShader.m_outputType);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  local_4d0 = (*pCVar5->_vptr_Context[0x75])(pCVar5,local_310);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  local_4d4 = (*pCVar5->_vptr_Context[0x75])
                        (pCVar5,&attachments.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
  sglr::ContextWrapper::glClearColor
            (&(this->super_FboTestCase).super_ContextWrapper,0.0,0.0,0.0,1.0);
  sglr::ContextWrapper::glClear(&(this->super_FboTestCase).super_ContextWrapper,0x4500);
  sglr::ContextWrapper::glGenFramebuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,
             (deUint32 *)&flatShader.super_ShaderProgram.field_0x154);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_FboTestCase).super_ContextWrapper,1,
             (deUint32 *)&flatShader.super_ShaderProgram.m_hasGeometryShader);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,
             flatShader.super_ShaderProgram._336_4_);
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  iVar3 = sglr::ContextWrapper::getWidth(this_00);
  iVar4 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  sglr::ContextWrapper::glTexImage2D(this_00,0xde1,0,0x8058,iVar3,iVar4,0,0x1908,0x1401,(void *)0x0)
  ;
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2801,0x2601);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,
             flatShader.super_ShaderProgram._340_4_);
  sglr::ContextWrapper::glFramebufferTexture2D
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8ce0,0xde1,
             flatShader.super_ShaderProgram._336_4_,0);
  sglr::ContextWrapper::glBindTexture(&(this->super_FboTestCase).super_ContextWrapper,0xde1,0);
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  sglr::ContextWrapper::glBindFramebuffer(&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  sglr::ContextWrapper::glStencilOp
            (&(this->super_FboTestCase).super_ContextWrapper,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207,1,0xff);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = gradShaderID;
  tcu::Vector<float,_4>::Vector(&local_4e4,1.0,0.0,0.0,1.0);
  FboTestUtil::FlatColorShader::setColor
            ((FlatColorShader *)&texShader.m_outputType,pCVar5,dVar1,&local_4e4);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = gradShaderID;
  tcu::Vector<float,_3>::Vector(&local_4f0,-1.0,-1.0,-1.0);
  tcu::Vector<float,_3>::Vector(&local_4fc,1.0,1.0,1.0);
  sglr::drawQuad(pCVar5,dVar1,&local_4f0,&local_4fc);
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texShaderID);
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texShaderID);
  if (bVar2) {
    local_600 = (deUint32 *)0x0;
  }
  else {
    local_600 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texShaderID,0);
  }
  sglr::ContextWrapper::glInvalidateFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,(int)sVar6,local_600);
  sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,
             flatShader.super_ShaderProgram._340_4_);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_4d4;
  tcu::Vector<float,_4>::Vector(&local_50c,0.0);
  tcu::Vector<float,_4>::Vector(&local_51c,1.0);
  FboTestUtil::GradientShader::setGradient
            ((GradientShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pCVar5,dVar1,&local_50c,&local_51c);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_4d4;
  tcu::Vector<float,_3>::Vector(&local_528,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_534,1.0,1.0,0.0);
  sglr::drawQuad(pCVar5,dVar1,&local_528,&local_534);
  sglr::ContextWrapper::glBindFramebuffer(&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0);
  if ((this->m_buffers & 0x4000) != 0) {
    pCVar5 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    dVar1 = gradShaderID;
    tcu::Vector<float,_4>::Vector(&local_544,0.0,1.0,0.0,1.0);
    FboTestUtil::FlatColorShader::setColor
              ((FlatColorShader *)&texShader.m_outputType,pCVar5,dVar1,&local_544);
    pCVar5 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    dVar1 = gradShaderID;
    tcu::Vector<float,_3>::Vector(&local_550,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_55c,1.0,1.0,0.0);
    sglr::drawQuad(pCVar5,dVar1,&local_550,&local_55c);
  }
  if ((this->m_buffers & 0x100) != 0) {
    sglr::ContextWrapper::glDepthFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207);
  }
  if ((this->m_buffers & 0x400) == 0) {
    sglr::ContextWrapper::glStencilFunc
              (&(this->super_FboTestCase).super_ContextWrapper,0x202,1,0xff);
  }
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xbe2);
  sglr::ContextWrapper::glBlendFunc(&(this->super_FboTestCase).super_ContextWrapper,1,1);
  sglr::ContextWrapper::glBlendEquation(&(this->super_FboTestCase).super_ContextWrapper,0x8006);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,
             flatShader.super_ShaderProgram._336_4_);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_310,pCVar5,local_4d0);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_4d0;
  tcu::Vector<float,_3>::Vector(&local_568,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_574,1.0,1.0,0.0);
  sglr::drawQuad(pCVar5,dVar1,&local_568,&local_574);
  iVar3 = sglr::ContextWrapper::getWidth(&(this->super_FboTestCase).super_ContextWrapper);
  iVar4 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  FboTestCase::readPixels(&this->super_FboTestCase,dst,0,0,iVar3,iVar4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texShaderID);
  FboTestUtil::GradientShader::~GradientShader
            ((GradientShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_310);
  FboTestUtil::FlatColorShader::~FlatColorShader((FlatColorShader *)&texShader.m_outputType);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		deUint32			fbo			= 0;
		deUint32			tex			= 0;
		FlatColorShader		flatShader	(glu::TYPE_FLOAT_VEC4);
		Texture2DShader		texShader	(DataTypes() << glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC4);
		GradientShader		gradShader	(glu::TYPE_FLOAT_VEC4);
		vector<deUint32>	attachments	= getDefaultFBDiscardAttachments(m_buffers);
		deUint32			flatShaderID= getCurrentContext()->createProgram(&flatShader);
		deUint32			texShaderID = getCurrentContext()->createProgram(&texShader);
		deUint32			gradShaderID= getCurrentContext()->createProgram(&gradShader);

		glClearColor	(0.0f, 0.0f, 0.0f, 1.0f);
		glClear			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		// Create fbo.
		glGenFramebuffers		(1, &fbo);
		glGenTextures			(1, &tex);
		glBindTexture			(GL_TEXTURE_2D, tex);
		glTexImage2D			(GL_TEXTURE_2D, 0, GL_RGBA8, getWidth(), getHeight(), 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
		glTexParameteri			(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glBindFramebuffer		(GL_FRAMEBUFFER, fbo);
		glFramebufferTexture2D	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, 0);
		glBindTexture			(GL_TEXTURE_2D, 0);
		checkFramebufferStatus	(GL_FRAMEBUFFER);

		glBindFramebuffer		(GL_FRAMEBUFFER, 0);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(1.0f, 0.0f, 0.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		glInvalidateFramebuffer(GL_FRAMEBUFFER, (int)attachments.size(), attachments.empty() ? DE_NULL : &attachments[0]);

		// Switch to fbo and render gradient into it.
		glDisable			(GL_DEPTH_TEST);
		glDisable			(GL_STENCIL_TEST);
		glBindFramebuffer	(GL_FRAMEBUFFER, fbo);

		gradShader.setGradient(*getCurrentContext(), gradShaderID, Vec4(0.0f), Vec4(1.0f));
		sglr::drawQuad(*getCurrentContext(), gradShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		// Restore default fbo.
		glBindFramebuffer	(GL_FRAMEBUFFER, 0);

		if ((m_buffers & GL_COLOR_BUFFER_BIT) != 0)
		{
			// Color was not preserved - fill with green.
			flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f));
			sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}

		if ((m_buffers & GL_DEPTH_BUFFER_BIT) != 0)
		{
			// Depth was not preserved.
			glDepthFunc(GL_ALWAYS);
		}

		if ((m_buffers & GL_STENCIL_BUFFER_BIT) == 0)
		{
			// Stencil was preserved.
			glStencilFunc(GL_EQUAL, 1, 0xff);
		}

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glEnable		(GL_BLEND);
		glBlendFunc		(GL_ONE, GL_ONE);
		glBlendEquation	(GL_FUNC_ADD);
		glBindTexture	(GL_TEXTURE_2D, tex);

		texShader.setUniforms(*getCurrentContext(), texShaderID);
		sglr::drawQuad(*getCurrentContext(), texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}